

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O1

wchar_t rd_artifacts(void)

{
  uint8_t *ip;
  ulong in_RAX;
  char *message;
  wchar_t wVar1;
  ulong uVar2;
  uint8_t tmp8u;
  uint16_t tmp16u;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  rd_u16b((uint16_t *)((long)&uStack_28 + 6));
  if (player->is_dead == true) {
    uStack_28 = CONCAT26(uStack_28._6_2_ + -0x28,(undefined6)uStack_28);
  }
  if (z_info->a_max < uStack_28._6_2_) {
    message = format("Too many (%u) artifacts!");
    note(message);
    wVar1 = L'\xffffffff';
  }
  else if (uStack_28._6_2_ == 0) {
    wVar1 = L'\0';
  }
  else {
    wVar1 = L'\0';
    ip = (uint8_t *)((long)&uStack_28 + 5);
    uVar2 = 0;
    do {
      rd_byte(ip);
      aup_info[uVar2].created = uStack_28._5_1_ != '\0';
      rd_byte(ip);
      aup_info[uVar2].seen = uStack_28._5_1_ != '\0';
      rd_byte(ip);
      aup_info[uVar2].everseen = uStack_28._5_1_ != '\0';
      rd_byte(ip);
      uVar2 = uVar2 + 1;
    } while (uVar2 < uStack_28 >> 0x30);
  }
  return wVar1;
}

Assistant:

int rd_artifacts(void)
{
	int i;
	uint16_t tmp16u;

	/* Load the Artifacts */
	rd_u16b(&tmp16u);
	if (player->is_dead) {
		/* No randarts loaded, so less artifacts to check */
		tmp16u -= ART_NUM_RANDOM;
	}
	if (tmp16u > z_info->a_max) {
		note(format("Too many (%u) artifacts!", tmp16u));
		return (-1);
	}

	/* Read the artifact flags */
	for (i = 0; i < tmp16u; i++) {
		uint8_t tmp8u;

		rd_byte(&tmp8u);
		aup_info[i].created = tmp8u ? true : false;
		rd_byte(&tmp8u);
		aup_info[i].seen = tmp8u ? true : false;
		rd_byte(&tmp8u);
		aup_info[i].everseen = tmp8u ? true : false;
		rd_byte(&tmp8u);
	}

	return 0;
}